

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O1

void __thiscall proto2_unittest::TestEnumMapPlusExtraLite::Clear(TestEnumMapPlusExtraLite *this)

{
  if (*(int *)((long)&this->field_0 + 4) != 1) {
    google::protobuf::internal::UntypedMapBase::ClearTableImpl
              ((UntypedMapBase *)&(this->field_0)._impl_,true);
  }
  if (*(int *)((long)&this->field_0 + 0x24) != 1) {
    google::protobuf::internal::UntypedMapBase::ClearTableImpl
              ((UntypedMapBase *)&(this->field_0)._impl_.unknown_map_field_,true);
  }
  if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestEnumMapPlusExtraLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestEnumMapPlusExtraLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.known_map_field_.Clear();
  _impl_.unknown_map_field_.Clear();
  _internal_metadata_.Clear<std::string>();
}